

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1526.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  curl_slist *pcVar4;
  size_t sVar5;
  curl_slist *tmp;
  curl_slist *phl;
  curl_slist *hhl;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  hhl._4_4_ = 2;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      lVar3 = curl_slist_append(0,"User-Agent: Http Agent");
      tmp = (curl_slist *)curl_slist_append(0,"User-Agent: Proxy Agent");
      if (((((lVar3 != 0) && (tmp != (curl_slist *)0x0)) &&
           (pcVar4 = (curl_slist *)curl_slist_append(tmp,"Expect:"), pcVar4 != (curl_slist *)0x0))
          && (((hhl._4_4_ = curl_easy_setopt(lVar2,0x2712,URL), tmp = pcVar4, hhl._4_4_ == 0 &&
               (hhl._4_4_ = curl_easy_setopt(lVar2,0x2714,libtest_arg2), hhl._4_4_ == 0)) &&
              ((hhl._4_4_ = curl_easy_setopt(lVar2,0x2727,lVar3), hhl._4_4_ == 0 &&
               ((hhl._4_4_ = curl_easy_setopt(lVar2,0x27f4,pcVar4), hhl._4_4_ == 0 &&
                (hhl._4_4_ = curl_easy_setopt(lVar2,0xe5,1), hhl._4_4_ == 0)))))))) &&
         ((hhl._4_4_ = curl_easy_setopt(lVar2,0x2f,0), hhl._4_4_ == 0 &&
          (((((hhl._4_4_ = curl_easy_setopt(lVar2,0x2e,1), hhl._4_4_ == 0 &&
              (hhl._4_4_ = curl_easy_setopt(lVar2,0x29,1), hhl._4_4_ == 0)) &&
             (hhl._4_4_ = curl_easy_setopt(lVar2,0x65,0), hhl._4_4_ == 0)) &&
            ((hhl._4_4_ = curl_easy_setopt(lVar2,0x2a,1), hhl._4_4_ == 0 &&
             (hhl._4_4_ = curl_easy_setopt(lVar2,0x4e2b,fwrite), hhl._4_4_ == 0)))) &&
           ((hhl._4_4_ = curl_easy_setopt(lVar2,0x4e2c,read_callback), hhl._4_4_ == 0 &&
            (hhl._4_4_ = curl_easy_setopt(lVar2,0x3d,1), hhl._4_4_ == 0)))))))) {
        sVar5 = strlen(data);
        hhl._4_4_ = curl_easy_setopt(lVar2,0xe,sVar5);
        if (hhl._4_4_ == 0) {
          hhl._4_4_ = curl_easy_perform(lVar2);
        }
      }
      curl_easy_cleanup(lVar2);
      curl_slist_free_all(lVar3);
      curl_slist_free_all(tmp);
      curl_global_cleanup();
      URL_local._4_4_ = hhl._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_FAILED_INIT;
  /* http and proxy header list*/
  struct curl_slist *hhl = NULL, *phl = NULL, *tmp = NULL;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  hhl = curl_slist_append(hhl, "User-Agent: Http Agent");
  phl = curl_slist_append(phl, "User-Agent: Proxy Agent");
  if(!hhl || !phl) {
    goto test_cleanup;
  }
  tmp = curl_slist_append(phl, "Expect:");
  if(!tmp) {
    goto test_cleanup;
  }
  phl = tmp;

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_PROXY, libtest_arg2);
  test_setopt(curl, CURLOPT_HTTPHEADER, hhl);
  test_setopt(curl, CURLOPT_PROXYHEADER, phl);
  test_setopt(curl, CURLOPT_HEADEROPT, CURLHEADER_SEPARATE);
  test_setopt(curl, CURLOPT_POST, 0L);
  test_setopt(curl, CURLOPT_UPLOAD, 1L);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_WRITEFUNCTION, fwrite);
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);
  test_setopt(curl, CURLOPT_HTTPPROXYTUNNEL, 1L);
  test_setopt(curl, CURLOPT_INFILESIZE, (long)strlen(data));

  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);

  curl_slist_free_all(hhl);

  curl_slist_free_all(phl);

  curl_global_cleanup();

  return (int)res;
}